

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exereader.cpp
# Opt level: O0

BinaryType loader::anon_unknown_0::determine_binary_type(istream *is)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  ulong uVar3;
  fpos<__mbstate_t> *in_RDI;
  uint16_t pe2_magic;
  uint16_t new_magic;
  uint16_t new_offset;
  uint16_t dos_magic;
  streamoff in_stack_ffffffffffffff88;
  fpos<__mbstate_t> *in_stack_ffffffffffffff90;
  fpos<__mbstate_t> *this;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_20;
  BinaryType local_4;
  
  std::fpos<__mbstate_t>::fpos(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::istream::seekg(in_RDI,local_28,local_20);
  uVar1 = util::load<unsigned_short>((istream *)0x16867d);
  uVar3 = std::ios::fail();
  if (((uVar3 & 1) == 0) && (uVar1 == 0x5a4d)) {
    this = in_RDI;
    std::fpos<__mbstate_t>::fpos(in_RDI,in_stack_ffffffffffffff88);
    std::istream::seekg(this,local_40,local_38);
    util::load<unsigned_short>((istream *)0x1686e5);
    uVar3 = std::ios::fail();
    if ((uVar3 & 1) == 0) {
      std::fpos<__mbstate_t>::fpos(this,(streamoff)in_RDI);
      std::istream::seekg(in_RDI,local_58,local_50);
      uVar1 = util::load<unsigned_short>((istream *)0x168743);
      uVar3 = std::ios::fail();
      if ((uVar3 & 1) == 0) {
        if (uVar1 == 0x4550) {
          uVar2 = util::load<unsigned_short>((istream *)0x16877f);
          uVar3 = std::ios::fail();
          if (((uVar3 & 1) != 0) || (uVar2 != 0)) {
            return DOSMagic;
          }
        }
        local_4 = (BinaryType)uVar1;
      }
      else {
        local_4 = DOSMagic;
      }
    }
    else {
      local_4 = DOSMagic;
    }
  }
  else {
    local_4 = PEMagic2;
  }
  return local_4;
}

Assistant:

BinaryType determine_binary_type(std::istream & is) {
	
	boost::uint16_t dos_magic = util::load<boost::uint16_t>(is.seekg(0));
	if(is.fail() || dos_magic != DOSMagic) {
		return UnknownBinary; // Not a DOS file
	}
	
	// Skip the DOS stub
	boost::uint16_t new_offset = util::load<boost::uint16_t>(is.seekg(0x3c));
	if(is.fail()) {
		return DOSMagic;
	}
	
	boost::uint16_t new_magic = util::load<boost::uint16_t>(is.seekg(new_offset));
	if(is.fail()) {
		return DOSMagic;
	}
	
	if(new_magic == PEMagic) {
		boost::uint16_t pe2_magic = util::load<boost::uint16_t>(is);
		if(is.fail() || pe2_magic != PEMagic2) {
			return DOSMagic;
		}
	}
	
	return BinaryType(new_magic);
}